

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

bool_t strEndsWith(char *str,char *suffix)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  
  sVar2 = strlen(str);
  sVar3 = strlen(suffix);
  if (sVar2 < sVar3) {
LAB_0011b0bb:
    bVar1 = 0;
  }
  else {
    bVar1 = 1;
    for (lVar4 = 0; suffix[lVar4] != '\0'; lVar4 = lVar4 + 1) {
      if (str[lVar4 + (sVar2 - sVar3)] != suffix[lVar4]) goto LAB_0011b0bb;
    }
  }
  return bVar1;
}

Assistant:

bool_t strEndsWith(const char* str, const char* suffix)
{
	ASSERT(strIsValid(str));
	ASSERT(strIsValid(suffix));
	if (strLen(str) < strLen(suffix))
		return FALSE;
	for(str += strLen(str) - strLen(suffix); *suffix; ++suffix, ++str)
		if (*str != *suffix)
			return FALSE;
	return TRUE;
}